

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_tga.c
# Opt level: O2

int read_image_tga(gdIOCtx *ctx,oTga *tga)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  void *buf;
  ulong uVar8;
  void *ptr;
  int iVar9;
  uint uVar10;
  size_t size;
  uint a;
  
  bVar1 = tga->bits;
  iVar4 = tga->width;
  iVar9 = tga->height;
  iVar3 = overflow2(iVar4,iVar9);
  if (iVar3 != 0) {
    return -1;
  }
  uVar10 = (uint)(bVar1 >> 3);
  iVar3 = overflow2(tga->height * tga->width,uVar10);
  if (iVar3 != 0) {
    return -1;
  }
  a = iVar9 * iVar4 * uVar10;
  iVar4 = overflow2(a,4);
  if (iVar4 != 0) {
    return -1;
  }
  if ((tga->imagetype | 8) != 10) {
    return -1;
  }
  size = (size_t)(int)a;
  piVar7 = (int *)gdMalloc(size * 4);
  tga->bitmap = piVar7;
  if (piVar7 == (int *)0x0) {
    return -1;
  }
  if (tga->imagetype == '\n') {
    ptr = gdMalloc(size * 4);
    if (ptr == (void *)0x0) {
      return -1;
    }
    buf = gdMalloc(size);
    if (buf == (void *)0x0) goto LAB_0011d6d0;
    uVar5 = gdGetBuf(buf,a,ctx);
    if (0 < (int)uVar5) {
      for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
        *(uint *)((long)ptr + uVar8 * 4) = (uint)*(byte *)((long)buf + uVar8);
      }
      iVar4 = 0;
      uVar8 = 0;
LAB_0011d714:
      iVar9 = (int)uVar8;
      if ((int)a <= iVar9) goto LAB_0011d808;
      if ((int)(uVar10 + iVar4) <= (int)uVar5) {
        uVar2 = *(uint *)((long)ptr + (long)iVar4 * 4);
        if (-1 < (char)uVar2) {
          iVar3 = (uVar2 + 1) * uVar10;
          if ((int)a < iVar3 + iVar9) goto LAB_0011d81b;
          iVar6 = iVar4 + 1;
          iVar4 = iVar3 + iVar6;
          if ((int)uVar5 < iVar4) goto LAB_0011d81b;
          memcpy(tga->bitmap + iVar9,(void *)((long)ptr + (long)iVar6 * 4),(long)iVar3 << 2);
          uVar8 = (ulong)(uint)(iVar3 + iVar9);
          goto LAB_0011d714;
        }
        if ((int)a < (int)(((uVar2 & 0xffffff7f) + 1) * uVar10 + iVar9)) goto LAB_0011d81b;
        iVar3 = iVar4 + 1;
        iVar4 = iVar3 + uVar10;
        if (iVar4 <= (int)uVar5) {
          uVar8 = (ulong)iVar9;
          for (iVar9 = 0; iVar9 <= (int)(uVar2 & 0xffffff7f); iVar9 = iVar9 + 1) {
            memcpy(tga->bitmap + uVar8,(void *)((long)ptr + (long)iVar3 * 4),(ulong)(uVar10 * 4));
            uVar8 = uVar8 + (bVar1 >> 3);
          }
          goto LAB_0011d714;
        }
      }
LAB_0011d81b:
      gdFree(ptr);
      iVar4 = -1;
      goto LAB_0011d828;
    }
    gdFree(buf);
    buf = ptr;
  }
  else {
    if (tga->imagetype != '\x02') {
      return 1;
    }
    buf = gdMalloc(size);
    if (buf == (void *)0x0) {
      return -1;
    }
    uVar10 = gdGetBuf(buf,a,ctx);
    ptr = buf;
    if (uVar10 == a) {
      uVar8 = 0;
      if ((int)a < 1) {
        a = 0;
      }
      iVar4 = 1;
      for (; a != uVar8; uVar8 = uVar8 + 1) {
        tga->bitmap[uVar8] = (uint)*(byte *)((long)buf + uVar8);
      }
      goto LAB_0011d828;
    }
LAB_0011d6d0:
    gd_error("gd-tga: premature end of image data\n");
    buf = ptr;
  }
  iVar4 = -1;
LAB_0011d828:
  gdFree(buf);
  return iVar4;
LAB_0011d808:
  gdFree(ptr);
  iVar4 = 1;
  goto LAB_0011d828;
}

Assistant:

int read_image_tga( gdIOCtx *ctx, oTga *tga )
{
	int pixel_block_size = (tga->bits / 8);
	int image_block_size = (tga->width * tga->height) * pixel_block_size;
	int* decompression_buffer = NULL;
	unsigned char* conversion_buffer = NULL;
	int buffer_caret = 0;
	int bitmap_caret = 0;
	int i = 0;
	int encoded_pixels;
	int rle_size;

	if(overflow2(tga->width, tga->height)) {
		return -1;
	}

	if(overflow2(tga->width * tga->height, pixel_block_size)) {
		return -1;
	}

	if(overflow2(image_block_size, sizeof(int))) {
		return -1;
	}

	/*! \todo Add more image type support.
	 */
	if (tga->imagetype != TGA_TYPE_RGB && tga->imagetype != TGA_TYPE_RGB_RLE)
		return -1;

	/*!	\brief Allocate memmory for image block
	 *  Allocate a chunk of memory for the image block to be passed into.
	 */
	tga->bitmap = (int *) gdMalloc(image_block_size * sizeof(int));
	if (tga->bitmap == NULL)
		return -1;

	switch (tga->imagetype) {
	case TGA_TYPE_RGB:
		/*! \brief Read in uncompressed RGB TGA
		 *  Chunk load the pixel data from an uncompressed RGB type TGA.
		 */
		conversion_buffer = (unsigned char *) gdMalloc(image_block_size * sizeof(unsigned char));
		if (conversion_buffer == NULL) {
			return -1;
		}

		if (gdGetBuf(conversion_buffer, image_block_size, ctx) != image_block_size) {
			gd_error("gd-tga: premature end of image data\n");
			gdFree(conversion_buffer);
			return -1;
		}

		while (buffer_caret < image_block_size) {
			tga->bitmap[buffer_caret] = (int) conversion_buffer[buffer_caret];
			buffer_caret++;
		}

		gdFree(conversion_buffer);
		break;

	case TGA_TYPE_RGB_RLE:
		/*! \brief Read in RLE compressed RGB TGA
		 *  Chunk load the pixel data from an RLE compressed RGB type TGA.
		 */
		decompression_buffer = (int*) gdMalloc(image_block_size * sizeof(int));
		if (decompression_buffer == NULL) {
			return -1;
		}
		conversion_buffer = (unsigned char *) gdMalloc(image_block_size * sizeof(unsigned char));
		if (conversion_buffer == NULL) {
			gd_error("gd-tga: premature end of image data\n");
			gdFree( decompression_buffer );
			return -1;
		}

		rle_size = gdGetBuf(conversion_buffer, image_block_size, ctx);
		if (rle_size <= 0) {
			gdFree(conversion_buffer);
			gdFree(decompression_buffer);
			return -1;
		}

		buffer_caret = 0;

		while( buffer_caret < rle_size) {
			decompression_buffer[buffer_caret] = (int)conversion_buffer[buffer_caret];
			buffer_caret++;
		}

		buffer_caret = 0;

		while( bitmap_caret < image_block_size ) {

			if (buffer_caret + pixel_block_size > rle_size) {
				gdFree( decompression_buffer );
				gdFree( conversion_buffer );
				return -1;
			}

			if ((decompression_buffer[buffer_caret] & TGA_RLE_FLAG) == TGA_RLE_FLAG) {
				encoded_pixels = ( ( decompression_buffer[ buffer_caret ] & ~TGA_RLE_FLAG ) + 1 );
				buffer_caret++;

				if ((bitmap_caret + (encoded_pixels * pixel_block_size)) > image_block_size
						|| buffer_caret + pixel_block_size > rle_size) {
					gdFree( decompression_buffer );
					gdFree( conversion_buffer );
					return -1;
				}

				for (i = 0; i < encoded_pixels; i++) {
					memcpy(tga->bitmap + bitmap_caret, decompression_buffer + buffer_caret, pixel_block_size * sizeof(int));
					bitmap_caret += pixel_block_size;
				}
				buffer_caret += pixel_block_size;

			} else {
				encoded_pixels = decompression_buffer[ buffer_caret ] + 1;
				buffer_caret++;

				if ((bitmap_caret + (encoded_pixels * pixel_block_size)) > image_block_size
						|| buffer_caret + (encoded_pixels * pixel_block_size) > rle_size) {
					gdFree( decompression_buffer );
					gdFree( conversion_buffer );
					return -1;
				}

				memcpy(tga->bitmap + bitmap_caret, decompression_buffer + buffer_caret, encoded_pixels * pixel_block_size * sizeof(int));
				bitmap_caret += (encoded_pixels * pixel_block_size);
				buffer_caret += (encoded_pixels * pixel_block_size);
			}
		}
		gdFree( decompression_buffer );
		gdFree( conversion_buffer );
		break;
	}

	return 1;
}